

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::Errors::RBDLInvalidFileError::RBDLInvalidFileError
          (RBDLInvalidFileError *this,string *text)

{
  string *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffc8;
  RBDLError *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,in_RSI);
  RBDLError::RBDLError(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  *in_RDI = &PTR__RBDLInvalidFileError_00933978;
  return;
}

Assistant:

RBDLInvalidFileError::RBDLInvalidFileError(std::string text): RBDLError(text) {}